

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O1

result<int,_toml::detail::none_t> __thiscall
toml::detail::from_string<int>(detail *this,string *str)

{
  int v;
  istringstream iss;
  int local_194;
  long local_190 [4];
  byte abStack_170 [88];
  ios_base local_118 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)str,_S_in);
  std::istream::operator>>((istream *)local_190,&local_194);
  if ((abStack_170[*(long *)(local_190[0] + -0x18)] & 5) == 0) {
    *this = (detail)0x1;
    *(int *)(this + 4) = local_194;
  }
  else {
    *this = (detail)0x0;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
  std::ios_base::~ios_base(local_118);
  return (result<int,_toml::detail::none_t>)this;
}

Assistant:

result<T, none_t> from_string(const std::string& str)
{
    T v;
    std::istringstream iss(str);
    iss >> v;
    if(iss.fail())
    {
        return err();
    }
    return ok(v);
}